

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O0

int genNetherScaled(NetherNoise *nn,int *out,Range r,int mc,uint64_t sha)

{
  Range r_00;
  Range r_01;
  Range r_02;
  int iVar1;
  uint64_t sha_00;
  ulong uVar2;
  int *out_00;
  undefined8 in_RCX;
  int in_EDX;
  long in_RSI;
  int in_stack_00000008;
  int in_stack_00000014;
  int in_stack_00000018;
  int in_stack_00000020;
  int y4;
  int z4;
  int x4;
  int *p;
  int k;
  int j;
  int i_1;
  int err;
  int *src;
  Range s;
  uint64_t i;
  uint64_t siz;
  undefined4 *puVar3;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  undefined4 uVar4;
  undefined4 uStack_74;
  int local_70;
  int local_6c;
  int local_68;
  float in_stack_ffffffffffffff9c;
  int *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int y;
  int x;
  undefined4 in_stack_ffffffffffffffe0;
  int local_4;
  
  puVar3 = &stack0x00000008;
  y = (int)in_RCX;
  x = (int)((ulong)in_RCX >> 0x20);
  if (in_stack_00000020 == 0) {
    in_stack_00000020 = 1;
  }
  sha_00 = (long)in_stack_00000014 * (long)in_stack_00000020 * (long)in_stack_00000018;
  if (in_EDX < 0x13) {
    for (uVar2 = 0; uVar2 < sha_00; uVar2 = uVar2 + 1) {
      *(undefined4 *)(in_RSI + uVar2 * 4) = 8;
    }
    local_4 = 0;
  }
  else if (in_stack_00000008 == 1) {
    r_00.z = in_stack_ffffffffffffff78;
    r_00._0_8_ = puVar3;
    r_00.sx = in_stack_ffffffffffffff7c;
    r_00.sz = in_stack_ffffffffffffff80;
    r_00.y = in_stack_ffffffffffffff84;
    r_00.sy = in_stack_ffffffffffffff88;
    getVoronoiSrcRange(r_00);
    if (sha_00 < 2) {
      out_00 = (int *)0x0;
    }
    else {
      out_00 = (int *)(in_RSI + sha_00 * 4);
      r_01.x = in_stack_ffffffffffffffc4;
      r_01.scale = in_stack_ffffffffffffffc0;
      r_01.z = in_stack_ffffffffffffffc8;
      r_01.sx = in_stack_ffffffffffffffcc;
      r_01.sz = (int)sha_00;
      r_01.y = (int)(sha_00 >> 0x20);
      r_01.sy = y;
      iVar1 = mapNether3D((NetherNoise *)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),out_00,r_01,
                          in_stack_ffffffffffffff9c);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    for (local_70 = 0; local_70 < (int)puVar3[6]; local_70 = local_70 + 1) {
      for (local_6c = 0; local_6c < (int)puVar3[4]; local_6c = local_6c + 1) {
        local_68 = 0;
        while( true ) {
          uStack_74 = (undefined4)((ulong)in_RSI >> 0x20);
          uVar4 = (undefined4)in_RSI;
          if ((int)puVar3[3] <= local_68) break;
          voronoiAccess3D(sha_00,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                          in_stack_ffffffffffffffc4,
                          (int *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                          (int *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          (int *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
          if (out_00 == (int *)0x0) {
            iVar1 = getNetherBiome((NetherNoise *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),x,y,
                                   (int)(sha_00 >> 0x20),
                                   (float *)CONCAT44(in_stack_ffffffffffffffcc,
                                                     in_stack_ffffffffffffffc8));
            *(int *)CONCAT44(uStack_74,uVar4) = iVar1;
          }
          else {
            in_stack_ffffffffffffff84 = in_stack_ffffffffffffff84 - in_stack_ffffffffffffffac;
            in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c - in_stack_ffffffffffffffbc;
            in_stack_ffffffffffffff80 = in_stack_ffffffffffffff80 - in_stack_ffffffffffffffb0;
            *(int *)CONCAT44(uStack_74,uVar4) =
                 out_00[(long)in_stack_ffffffffffffff7c * (long)in_stack_ffffffffffffffb4 *
                        (long)in_stack_ffffffffffffffb8 +
                        (long)in_stack_ffffffffffffff80 * (long)in_stack_ffffffffffffffb4 +
                        (long)in_stack_ffffffffffffff84];
          }
          in_RSI = CONCAT44(uStack_74,uVar4) + 4;
          local_68 = local_68 + 1;
        }
      }
    }
    local_4 = 0;
  }
  else {
    r_02.x = in_stack_ffffffffffffffc4;
    r_02.scale = in_stack_ffffffffffffffc0;
    r_02.z = in_stack_ffffffffffffffc8;
    r_02.sx = in_stack_ffffffffffffffcc;
    r_02.sz = (int)sha_00;
    r_02.y = (int)(sha_00 >> 0x20);
    r_02.sy = y;
    local_4 = mapNether3D((NetherNoise *)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                          in_stack_ffffffffffffffa0,r_02,in_stack_ffffffffffffff9c);
  }
  return local_4;
}

Assistant:

int genNetherScaled(const NetherNoise *nn, int *out, Range r, int mc, uint64_t sha)
{
    if (r.scale <= 0) r.scale = 4;
    if (r.sy == 0) r.sy = 1;

    uint64_t siz = (uint64_t)r.sx*r.sy*r.sz;

    if (mc <= MC_1_15)
    {
        uint64_t i;
        for (i = 0; i < siz; i++)
            out[i] = nether_wastes;
        return 0;
    }

    if (r.scale == 1)
    {
        Range s = getVoronoiSrcRange(r);
        int *src;
        if (siz > 1)
        {   // the source range is large enough that we can try optimizing
            src = out + siz;
            int err = mapNether3D(nn, src, s, 1.0);
            if (err)
                return err;
        }
        else
        {
            src = NULL;
        }

        int i, j, k;
        int *p = out;
        for (k = 0; k < r.sy; k++)
        {
            for (j = 0; j < r.sz; j++)
            {
                for (i = 0; i < r.sx; i++)
                {
                    int x4, z4, y4;
                    voronoiAccess3D(sha, r.x+i, r.y+k, r.z+j, &x4, &y4, &z4);
                    if (src)
                    {
                        x4 -= s.x; y4 -= s.y; z4 -= s.z;
                        *p = src[(int64_t)y4*s.sx*s.sz + (int64_t)z4*s.sx + x4];
                    }
                    else
                    {
                        *p = getNetherBiome(nn, x4, y4, z4, NULL);
                    }
                    p++;
                }
            }
        }
        return 0;
    }
    else
    {
        return mapNether3D(nn, out, r, 1.0);
    }
}